

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

int Ver_ParseDriveFormal(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Ver_Bundle_t *pBundle0)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pObj;
  char *__s2;
  void *pvVar6;
  Abc_Obj_t *pAVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  Ver_Bundle_t *pBundle;
  long lVar12;
  ulong uVar13;
  char Buffer [200];
  char local_f8 [200];
  
  iVar3 = pBundle0->vNetsActual->nSize;
  if (0 < iVar3) {
    uVar11 = 0;
    do {
      if (iVar3 == 1) {
        strcpy(local_f8,pBundle0->pNameFormal);
      }
      else {
        sprintf(local_f8,"%s[%d]",pBundle0->pNameFormal,uVar11);
      }
      pAVar4 = Abc_NtkFindNet(pNtk,local_f8);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        __assert_fail("Abc_NtkFindNet( pNtk, Buffer ) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0xa00,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)");
      }
      pAVar4 = Abc_NtkFindOrCreateNet(pNtk,local_f8);
      pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
      iVar3 = pNtk->vBoxes->nSize;
      if (1 < iVar3) {
        __assert_fail("Abc_NtkBoxNum(pNtk) <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0xa04,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)");
      }
      if (iVar3 == 0) {
        pAVar7 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BLACKBOX);
      }
      else {
        if (iVar3 != 1) {
LAB_0034fc0a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar7 = (Abc_Obj_t *)*pNtk->vBoxes->pArray;
      }
      pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      Abc_ObjAddFanin(pObj,pAVar4);
      Abc_ObjAddFanin(pAVar4,pAVar5);
      Abc_ObjAddFanin(pAVar5,pAVar7);
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
      iVar3 = pBundle0->vNetsActual->nSize;
    } while ((int)uVar10 < iVar3);
  }
  __s2 = Extra_UtilStrsav(pBundle0->pNameFormal);
  pvVar6 = pNtk->pData;
  if (0 < *(int *)((long)pvVar6 + 4)) {
    lVar9 = 0;
    pBundle = (Ver_Bundle_t *)0x0;
    do {
      pAVar4 = *(Abc_Obj_t **)(*(long *)((long)pvVar6 + 8) + lVar9 * 8);
      pAVar5 = (pAVar4->field_6).pCopy;
      uVar1 = *(uint *)((long)&pAVar5->pNtk + 4);
      uVar10 = uVar1 - 1;
      if ((int)uVar1 < 1) {
        uVar11 = (ulong)uVar1;
      }
      else {
        uVar11 = (ulong)uVar10 + 1;
        do {
          if ((int)uVar1 < (int)uVar11) goto LAB_0034fc0a;
          pBundle = *(Ver_Bundle_t **)((long)pAVar5->pNext + uVar11 * 8 + -8);
          if ((pBundle != (Ver_Bundle_t *)0x0) &&
             (iVar3 = strcmp(pBundle->pNameFormal,__s2), iVar3 == 0)) {
            uVar10 = (int)uVar11 - 1;
            goto LAB_0034fac7;
          }
          uVar13 = uVar11 - 1;
          bVar2 = 0 < (long)uVar11;
          uVar11 = uVar13;
        } while (uVar13 != 0 && bVar2);
        uVar11 = 0;
        uVar10 = 0xffffffff;
      }
LAB_0034fac7:
      if (uVar10 != uVar1) {
        if (pBundle == (Ver_Bundle_t *)0x0) {
          __assert_fail("pBundle",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                        ,0xa17,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)")
          ;
        }
        iVar3 = pBundle->vNetsActual->nSize;
        lVar12 = (long)iVar3;
        if (0 < lVar12) {
          lVar8 = 0;
          do {
            if (0 < *(int *)((long)pBundle->vNetsActual->pArray[lVar8] + 0x1c)) {
              sprintf(pMan->sError,"Missing specification of the I/Os of undefined box \"%s\".",
                      pNtk->pName);
              Ver_ParsePrintErrorMessage(pMan);
              return 0;
            }
            lVar8 = lVar8 + 1;
          } while (lVar12 != lVar8);
        }
        if (0 < iVar3) {
          do {
            if (pBundle->vNetsActual->nSize < lVar12) goto LAB_0034fc0a;
            pAVar5 = (Abc_Obj_t *)pBundle->vNetsActual->pArray[lVar12 + -1];
            pAVar7 = Abc_NtkCreateObj(pAVar5->pNtk,ABC_OBJ_BO);
            Abc_ObjAddFanin(pAVar7,pAVar4);
            Abc_ObjAddFanin(pAVar5,pAVar7);
            bVar2 = 1 < lVar12;
            lVar12 = lVar12 + -1;
          } while (bVar2);
        }
        Ver_ParseFreeBundle(pBundle);
        if (((int)uVar11 < 1) ||
           (*(int *)((long)&((pAVar4->field_6).pCopy)->pNtk + 4) < (int)uVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        (&((pAVar4->field_6).pCopy)->pNext->pNtk)[uVar10] = (Abc_Ntk_t *)0x0;
        pBundle = (Ver_Bundle_t *)0x0;
      }
      lVar9 = lVar9 + 1;
      pvVar6 = pNtk->pData;
    } while (lVar9 < *(int *)((long)pvVar6 + 4));
  }
  if (__s2 != (char *)0x0) {
    free(__s2);
  }
  return 1;
}

Assistant:

int Ver_ParseDriveFormal( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Ver_Bundle_t * pBundle0 )
{
    char Buffer[200];
    char * pName;
    Ver_Bundle_t * pBundle = NULL;
    Abc_Obj_t * pBox, * pTerm, * pTermNew, * pNetAct, * pNetFormal;
    int k, j, m;

    // drive this net in the undef box
    Vec_PtrForEachEntry( Abc_Obj_t *, pBundle0->vNetsActual, pNetAct, m )
    {
        // create the formal net
        if ( Vec_PtrSize(pBundle0->vNetsActual) == 1 )
            sprintf( Buffer, "%s", pBundle0->pNameFormal );
        else
            sprintf( Buffer, "%s[%d]", pBundle0->pNameFormal, m );
        assert( Abc_NtkFindNet( pNtk, Buffer ) == NULL );
        pNetFormal = Abc_NtkFindOrCreateNet( pNtk, Buffer );
        // connect it to the box
        pTerm = Abc_NtkCreateBo( pNtk );
        assert( Abc_NtkBoxNum(pNtk) <= 1 );
        pBox = Abc_NtkBoxNum(pNtk)? Abc_NtkBox(pNtk,0) : Abc_NtkCreateBlackbox(pNtk);
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pNetFormal );
        Abc_ObjAddFanin( pNetFormal, pTerm );
        Abc_ObjAddFanin( pTerm, pBox );
    }

    // go through instances of this type
    pName = Extra_UtilStrsav(pBundle0->pNameFormal);
    Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
    {
        // find a bundle with the given name in this instance
        Vec_PtrForEachEntryReverse( Ver_Bundle_t *, (Vec_Ptr_t *)pBox->pCopy, pBundle, j )
            if ( pBundle && !strcmp( pBundle->pNameFormal, pName ) )
                break;
        // skip non-driven bundles
        if ( j == Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
            continue;
        // check if any nets are driven in this bundle
        assert(pBundle); // Verify pBundle was assigned to.
        Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNetAct, m )
            if ( Abc_ObjFaninNum(pNetAct) > 0 )
            {
                sprintf( pMan->sError, "Missing specification of the I/Os of undefined box \"%s\".", Abc_NtkName(pNtk) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
        // drive the nets by the undef box
        Vec_PtrForEachEntryReverse( Abc_Obj_t *, pBundle->vNetsActual, pNetAct, m )
        {
            pTermNew = Abc_NtkCreateBo( pNetAct->pNtk );
            Abc_ObjAddFanin( pTermNew, pBox );
            Abc_ObjAddFanin( pNetAct, pTermNew );
        }
        // remove the bundle
        Ver_ParseFreeBundle( pBundle ); pBundle = NULL;
        Vec_PtrWriteEntry( (Vec_Ptr_t *)pBox->pCopy, j, NULL );
    }
    ABC_FREE( pName );
    return 1;
}